

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hmac.c
# Opt level: O0

int hmac(SHAversion whichSha,uchar *text,int text_len,uchar *key,int key_len,uint8_t *digest)

{
  int iVar1;
  bool local_1b1;
  undefined1 local_1b0 [8];
  HMACContext ctx;
  uint8_t *digest_local;
  int key_len_local;
  uchar *key_local;
  int text_len_local;
  uchar *text_local;
  SHAversion whichSha_local;
  
  ctx.k_opad._120_8_ = digest;
  iVar1 = hmacReset((HMACContext *)local_1b0,whichSha,key,key_len);
  local_1b1 = true;
  if (iVar1 == 0) {
    iVar1 = hmacInput((HMACContext *)local_1b0,text,text_len);
    local_1b1 = true;
    if (iVar1 == 0) {
      iVar1 = hmacResult((HMACContext *)local_1b0,(uint8_t *)ctx.k_opad._120_8_);
      local_1b1 = iVar1 != 0;
    }
  }
  return (int)local_1b1;
}

Assistant:

int hmac(SHAversion whichSha, const unsigned char *text, int text_len,
    const unsigned char *key, int key_len,
    uint8_t digest[USHAMaxHashSize])
{
    HMACContext ctx;
    return hmacReset(&ctx, whichSha, key, key_len) ||
        hmacInput(&ctx, text, text_len) ||
        hmacResult(&ctx, digest);
}